

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_reader.cpp
# Opt level: O0

void __thiscall
duckdb::MetadataReader::ReadData(MetadataReader *this,data_ptr_t buffer,idx_t read_size)

{
  size_t __n;
  data_ptr_t pdVar1;
  size_t in_RDX;
  MetadataReader *in_RSI;
  long in_RDI;
  idx_t to_read;
  MetadataReader *in_stack_000000a0;
  MetadataReader *in_stack_ffffffffffffffd0;
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  while (*(ulong *)(in_RDI + 0x68) < *(long *)(in_RDI + 0x58) + local_18) {
    __n = *(long *)(in_RDI + 0x68) - *(long *)(in_RDI + 0x58);
    if (__n != 0) {
      in_stack_ffffffffffffffd0 = local_10;
      pdVar1 = Ptr(local_10);
      memcpy(in_stack_ffffffffffffffd0,pdVar1,__n);
      local_18 = local_18 - __n;
      local_10 = (MetadataReader *)(__n + (long)local_10);
      *(size_t *)(in_RDI + 0x58) = local_18 + *(long *)(in_RDI + 0x58);
    }
    ReadNextBlock(in_stack_000000a0);
  }
  pdVar1 = Ptr(in_stack_ffffffffffffffd0);
  memcpy(local_10,pdVar1,local_18);
  *(size_t *)(in_RDI + 0x58) = local_18 + *(long *)(in_RDI + 0x58);
  return;
}

Assistant:

void MetadataReader::ReadData(data_ptr_t buffer, idx_t read_size) {
	while (offset + read_size > capacity) {
		// cannot read entire entry from block
		// first read what we can from this block
		idx_t to_read = capacity - offset;
		if (to_read > 0) {
			memcpy(buffer, Ptr(), to_read);
			read_size -= to_read;
			buffer += to_read;
			offset += read_size;
		}
		// then move to the next block
		ReadNextBlock();
	}
	// we have enough left in this block to read from the buffer
	memcpy(buffer, Ptr(), read_size);
	offset += read_size;
}